

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# part_attr.c
# Opt level: O1

exr_result_t exr_attr_set_v2i(exr_context_t ctxt,int part_index,char *name,exr_attr_v2i_t *val)

{
  exr_result_t eVar1;
  int iVar2;
  code *UNRECOVERED_JUMPTABLE;
  char *pcVar3;
  undefined8 uVar4;
  char *pcVar5;
  exr_attribute_list_t *list;
  exr_attribute_t *attr;
  exr_attribute_t *local_30;
  
  local_30 = (exr_attribute_t *)0x0;
  if (ctxt == (exr_context_t)0x0) {
    return 2;
  }
  if ((part_index < 0) || (*(int *)(ctxt + 0xc4) <= part_index)) {
    eVar1 = (**(code **)(ctxt + 0x48))
                      (ctxt,4,"Part index (%d) out of range",part_index,*(code **)(ctxt + 0x48));
    return eVar1;
  }
  if (*ctxt == (_priv_exr_context_t)0x3) {
    UNRECOVERED_JUMPTABLE = *(code **)(ctxt + 0x38);
    uVar4 = 0x15;
LAB_0011c455:
    eVar1 = (*UNRECOVERED_JUMPTABLE)(ctxt,uVar4);
    return eVar1;
  }
  if (*ctxt == (_priv_exr_context_t)0x0) {
    UNRECOVERED_JUMPTABLE = *(code **)(ctxt + 0x38);
    uVar4 = 8;
    goto LAB_0011c455;
  }
  list = (exr_attribute_list_t *)
         (*(long *)(*(long *)(ctxt + 0x1d8) + (ulong)(uint)part_index * 8) + 8);
  eVar1 = exr_attr_list_find_by_name(ctxt,list,name,&local_30);
  if (eVar1 == 0) {
    iVar2 = 0;
    if (local_30->type != EXR_ATTR_V2I) {
      pcVar5 = local_30->type_name;
      pcVar3 = "\'%s\' requested type \'v2i\', but stored attributes is type \'%s\'";
      uVar4 = 0x10;
      goto LAB_0011c516;
    }
  }
  else {
    if (eVar1 != 0xf) {
      return eVar1;
    }
    if (*ctxt != (_priv_exr_context_t)0x1) {
      return 0xf;
    }
    iVar2 = exr_attr_list_add(ctxt,list,name,EXR_ATTR_V2I,0,(uint8_t **)0x0,&local_30);
  }
  if (val != (exr_attr_v2i_t *)0x0) {
    if (iVar2 != 0) {
      return iVar2;
    }
    ((anon_union_8_2_77b2bb39_for_exr_attr_v2i_t_0 *)(local_30->field_6).box2i)->field_0 =
         (anon_struct_8_2_947311e6_for_anon_union_8_2_77b2bb39_for_exr_attr_v2i_t_0_0)val->field_0;
    return 0;
  }
  pcVar3 = "No input value for setting \'%s\', type \'%s\'";
  pcVar5 = "v2i";
  uVar4 = 3;
LAB_0011c516:
  eVar1 = (**(code **)(ctxt + 0x48))(ctxt,uVar4,pcVar3,name,pcVar5);
  return eVar1;
}

Assistant:

exr_result_t
exr_attr_set_v2i (
    exr_context_t         ctxt,
    int                   part_index,
    const char*           name,
    const exr_attr_v2i_t* val)
{
    ATTR_SET_IMPL_DEREF (EXR_ATTR_V2I, v2i);
}